

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaxi.c
# Opt level: O1

Vec_Int_t * Gia_ManMaxiPerform(Gia_Man_t *p,Vec_Int_t *vInit,int nFrames,int nTimeOut,int fVerbose)

{
  uint uVar1;
  Cnf_Dat_t *pCVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *pGVar7;
  Gia_Man_t *pGVar8;
  Aig_Man_t *pAig;
  sat_solver *psVar9;
  long lVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  Vec_Int_t *pVVar13;
  void *__s;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  long lVar18;
  abctime aVar19;
  Vec_Int_t *pVVar20;
  ulong uVar21;
  timespec ts;
  timespec local_80;
  Vec_Int_t *local_70;
  Gia_Man_t *local_68;
  sat_solver *local_60;
  uint local_54;
  Cnf_Dat_t *local_50;
  Gia_Man_t *local_48;
  long local_40;
  ulong local_38;
  
  local_70 = vInit;
  local_54 = nTimeOut;
  iVar3 = clock_gettime(3,&local_80);
  pVVar11 = local_70;
  if (iVar3 < 0) {
    lVar16 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
    lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_80.tv_sec * -1000000;
  }
  pGVar7 = Gia_ManMaxiUnfold(p,nFrames,0,local_70);
  pGVar8 = Gia_ManMaxiUnfold(p,nFrames,1,pVVar11);
  local_48 = p;
  local_68 = Gia_ManMiter(pGVar7,pGVar8,0,0,0,0,0);
  pAig = Gia_ManToAigSimple(local_68);
  pAig->nRegs = 0;
  local_50 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Aig_ManStop(pAig);
  Gia_ManStop(pGVar7);
  pGVar7 = local_48;
  Gia_ManStop(pGVar8);
  if (pGVar7->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                  ,0x98,"Vec_Int_t *Gia_ManMaxiPerform(Gia_Man_t *, Vec_Int_t *, int, int, int)");
  }
  if (fVerbose != 0) {
    pcVar17 = "";
    if (local_70 == (Vec_Int_t *)0x0) {
      pcVar17 = "no ";
    }
    printf("Running with %d frames and %sgiven init state.\n",(ulong)(uint)nFrames,pcVar17);
  }
  psVar9 = sat_solver_new();
  pCVar2 = local_50;
  sat_solver_setnvars(psVar9,local_50->nVars);
  pGVar8 = local_68;
  if (local_54 == 0) {
    aVar19 = 0;
  }
  else {
    lVar10 = (long)(int)local_54;
    iVar3 = clock_gettime(3,&local_80);
    if (iVar3 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    aVar19 = lVar18 + lVar10 * 1000000;
  }
  psVar9->nRuntimeLimit = aVar19;
  lVar10 = 0;
  while (lVar10 < pCVar2->nClauses) {
    iVar3 = sat_solver_addclause(psVar9,pCVar2->pClauses[lVar10],pCVar2->pClauses[lVar10 + 1]);
    lVar10 = lVar10 + 1;
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                    ,0xa1,"Vec_Int_t *Gia_ManMaxiPerform(Gia_Man_t *, Vec_Int_t *, int, int, int)");
    }
  }
  iVar3 = pGVar7->vCos->nSize;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar5 = iVar3;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar5;
  local_60 = psVar9;
  if (iVar5 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar11->pArray = piVar12;
  pVVar13 = pGVar8->vCos;
  if (0 < pVVar13->nSize) {
    lVar10 = 0;
    do {
      iVar3 = pVVar13->pArray[lVar10];
      if (((long)iVar3 < 0) || (pGVar8->nObjs <= iVar3)) goto LAB_005aa455;
      if (pGVar8->pObjs == (Gia_Obj_t *)0x0) break;
      if (pCVar2->pVarNums[iVar3] < 0) goto LAB_005aa4d1;
      Vec_IntPush(pVVar11,pCVar2->pVarNums[iVar3] * 2);
      lVar10 = lVar10 + 1;
      pVVar13 = pGVar8->vCos;
    } while (lVar10 < pVVar13->nSize);
  }
  sat_solver_addclause(local_60,pVVar11->pArray,pVVar11->pArray + pVVar11->nSize);
  pVVar11->nSize = 0;
  pVVar13 = pGVar8->vCis;
  uVar14 = (ulong)(uint)pVVar13->nSize;
  if (pGVar8->nRegs < pVVar13->nSize) {
    uVar21 = 0;
    pVVar20 = local_70;
    do {
      if ((long)(int)uVar14 <= (long)uVar21) goto LAB_005aa474;
      iVar3 = pVVar13->pArray[uVar21];
      if (((long)iVar3 < 0) || (pGVar8->nObjs <= iVar3)) goto LAB_005aa455;
      if ((pGVar8->pObjs == (Gia_Obj_t *)0x0) || (uVar21 == (uint)pGVar7->nRegs)) break;
      if ((long)pVVar20->nSize <= (long)uVar21) goto LAB_005aa474;
      if ((uint)pVVar20->pArray[uVar21] < 2) {
        if (pGVar8->nObjs <= iVar3) goto LAB_005aa50f;
        if (pCVar2->pVarNums[iVar3] < 0) {
LAB_005aa4d1:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(pVVar11,pCVar2->pVarNums[iVar3] * 2 + 1);
        pVVar20 = local_70;
      }
      uVar21 = uVar21 + 1;
      pVVar13 = pGVar8->vCis;
      uVar14 = (ulong)pVVar13->nSize;
    } while ((long)uVar21 < (long)(uVar14 - (long)pGVar8->nRegs));
  }
  local_40 = lVar16;
  if (fVerbose != 0) {
    printf("Iter%6d : ",0);
    psVar9 = local_60;
    uVar4 = sat_solver_nvars(local_60);
    printf("Var =%10d  ",(ulong)uVar4);
    uVar4 = sat_solver_nclauses(psVar9);
    printf("Clause =%10d  ",(ulong)uVar4);
    uVar4 = sat_solver_nconflicts(psVar9);
    printf("Conflict =%10d  ",(ulong)uVar4);
    iVar3 = 0x9ed799;
    printf("Subset =%6d  ",(ulong)(uint)pVVar11->nSize);
    Abc_Print(iVar3,"%s =","Time");
    Abc_Print(iVar3,"%9.2f sec\n",0);
  }
  uVar4 = 0;
  lVar16 = 0;
  do {
    iVar3 = clock_gettime(3,&local_80);
    if (iVar3 < 0) {
      lVar10 = 1;
    }
    else {
      lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
      lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_80.tv_sec * -1000000;
    }
    local_38 = (ulong)pVVar11->nSize;
    iVar3 = sat_solver_solve(local_60,pVVar11->pArray,pVVar11->pArray + local_38,0,0,0,0);
    iVar5 = clock_gettime(3,&local_80);
    psVar9 = local_60;
    if (iVar5 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    if (iVar3 != -1) {
      if (iVar3 == 1) {
        printf("The problem is SAT after %d iterations.  ");
      }
      else {
        if (iVar3 != 0) {
          __assert_fail("status == l_False",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                        ,0xce,
                        "Vec_Int_t *Gia_ManMaxiPerform(Gia_Man_t *, Vec_Int_t *, int, int, int)");
        }
        pcVar17 = "Timeout reached after %d seconds and %d iterations.  ";
        uVar14 = (ulong)local_54;
LAB_005aa1c5:
        printf(pcVar17,uVar14,(ulong)uVar4);
      }
      break;
    }
    lVar16 = lVar16 + lVar10 + lVar18;
    piVar12 = (local_60->conf_final).ptr;
    uVar1 = (local_60->conf_final).size;
    if (fVerbose != 0) {
      printf("Iter%6d : ",(ulong)(uVar4 + 1));
      uVar6 = sat_solver_nvars(psVar9);
      printf("Var =%10d  ",(ulong)uVar6);
      uVar6 = sat_solver_nclauses(psVar9);
      printf("Clause =%10d  ",(ulong)uVar6);
      uVar6 = sat_solver_nconflicts(psVar9);
      printf("Conflict =%10d  ",(ulong)uVar6);
      iVar3 = 0x9ed799;
      printf("Subset =%6d  ",(ulong)uVar1);
      Abc_Print(iVar3,"%s =","Time");
      Abc_Print(iVar3,"%9.2f sec\n",(double)lVar16 / 1000000.0);
    }
    if ((uint)local_38 == uVar1) {
      uVar4 = uVar4 + 1;
      pcVar17 = "Reached fixed point with %d entries after %d iterations.  ";
      uVar14 = local_38;
      goto LAB_005aa1c5;
    }
    pVVar11->nSize = 0;
    if (0 < (int)uVar1) {
      uVar14 = 0;
      do {
        uVar6 = piVar12[uVar14];
        if ((int)uVar6 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x131,"int Abc_LitNot(int)");
        }
        Vec_IntPush(pVVar11,uVar6 ^ 1);
        uVar14 = uVar14 + 1;
      } while (uVar1 != uVar14);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 1000000);
  pGVar7 = local_68;
  iVar3 = local_50->nVars;
  iVar5 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar5 = iVar3;
  }
  if (iVar5 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar5 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar3 * 4);
  }
  iVar5 = pVVar11->nSize;
  if (0 < (long)iVar5) {
    piVar12 = pVVar11->pArray;
    lVar16 = 0;
    do {
      if (piVar12[lVar16] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar4 = (uint)piVar12[lVar16] >> 1;
      if (iVar3 <= (int)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)((long)__s + (ulong)uVar4 * 4) = 1;
      lVar16 = lVar16 + 1;
    } while (iVar5 != lVar16);
  }
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  free(pVVar11);
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  uVar4 = local_70->nSize;
  lVar16 = (long)(int)uVar4;
  pVVar11->nSize = uVar4;
  pVVar11->nCap = uVar4;
  if (lVar16 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc(lVar16 * 4);
  }
  pVVar11->pArray = piVar12;
  memcpy(piVar12,local_70->pArray,lVar16 * 4);
  pVVar13 = pGVar7->vCis;
  uVar14 = (ulong)(uint)pVVar13->nSize;
  if (pGVar7->nRegs < pVVar13->nSize) {
    uVar15 = 0;
    uVar21 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar21 = uVar15;
    }
LAB_005aa2dc:
    if ((long)(int)uVar14 <= (long)uVar15) {
LAB_005aa474:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar5 = pVVar13->pArray[uVar15];
    if (((long)iVar5 < 0) || (pGVar7->nObjs <= iVar5)) {
LAB_005aa455:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if ((pGVar7->pObjs != (Gia_Obj_t *)0x0) && (uVar15 != (uint)local_48->nRegs)) {
      if (uVar21 == uVar15) goto LAB_005aa474;
      if ((uint)piVar12[uVar15] < 2) {
        if (pGVar7->nObjs <= iVar5) {
LAB_005aa50f:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar5 = local_50->pVarNums[iVar5];
        if (((long)iVar5 < 0) || (iVar3 <= iVar5)) goto LAB_005aa474;
        if (*(int *)((long)__s + (long)iVar5 * 4) == 0) {
          piVar12[uVar15] = piVar12[uVar15] | 2;
        }
      }
      uVar15 = uVar15 + 1;
      uVar14 = (ulong)pVVar13->nSize;
      if ((long)uVar15 < (long)(uVar14 - (long)pGVar7->nRegs)) goto LAB_005aa2dc;
    }
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  sat_solver_delete(local_60);
  Cnf_DataFree(local_50);
  Gia_ManStop(pGVar7);
  iVar5 = 3;
  iVar3 = clock_gettime(3,&local_80);
  if (iVar3 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
  }
  lVar16 = lVar16 + local_40;
  Abc_Print(iVar5,"%s =","Total runtime");
  Abc_Print(iVar5,"%9.2f sec\n",(double)lVar16 / 1000000.0);
  return pVVar11;
}

Assistant:

Vec_Int_t * Gia_ManMaxiPerform( Gia_Man_t * p, Vec_Int_t * vInit, int nFrames, int nTimeOut, int fVerbose )
{
    int nIterMax = 1000000;
    int i, iLit, Iter, status;
    int nLits, * pLits;
    abctime clkTotal = Abc_Clock();
    abctime clkSat = 0;
    Vec_Int_t * vLits, * vMap;
    sat_solver * pSat;
    Gia_Obj_t * pObj;
    Gia_Man_t * p0 = Gia_ManMaxiUnfold( p, nFrames, 0, vInit );
    Gia_Man_t * p1 = Gia_ManMaxiUnfold( p, nFrames, 1, vInit );
    Gia_Man_t * pM = Gia_ManMiter( p0, p1, 0, 0, 0, 0, 0 );
    Cnf_Dat_t * pCnf = Cnf_DeriveGiaRemapped( pM );
    Gia_ManStop( p0 );
    Gia_ManStop( p1 );
    assert( Gia_ManRegNum(p) > 0 );
    if ( fVerbose )
        printf( "Running with %d frames and %sgiven init state.\n", nFrames, vInit ? "":"no " );

    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );

    // add one large OR clause
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( pM, pObj, i )
        Vec_IntPush( vLits, Abc_Var2Lit(pCnf->pVarNums[Gia_ObjId(pM, pObj)], 0) );
    sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );

    // create assumptions
    Vec_IntClear( vLits );
    Gia_ManForEachPi( pM, pObj, i )
        if ( i == Gia_ManRegNum(p) )
            break;
        else if ( Vec_IntEntry(vInit, i) == 0 || Vec_IntEntry(vInit, i) == 1 )
            Vec_IntPush( vLits, Abc_Var2Lit(pCnf->pVarNums[Gia_ObjId(pM, pObj)], 1) );

    if ( fVerbose )
    {
        printf( "Iter%6d : ",       0 );
        printf( "Var =%10d  ",      sat_solver_nvars(pSat) );
        printf( "Clause =%10d  ",   sat_solver_nclauses(pSat) );
        printf( "Conflict =%10d  ", sat_solver_nconflicts(pSat) );
        printf( "Subset =%6d  ",    Vec_IntSize(vLits) );
        Abc_PrintTime( 1, "Time", clkSat );
//      ABC_PRTr( "Solver time", clkSat );
    }
    for ( Iter = 0; Iter < nIterMax; Iter++ )
    {
        abctime clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        clkSat += Abc_Clock() - clk;
        if ( status == l_Undef )
        {
//            if ( fVerbose )
//                printf( "\n" );
            printf( "Timeout reached after %d seconds and %d iterations.  ", nTimeOut, Iter );
            break;
        }
        if ( status == l_True )
        {
//            if ( fVerbose )
//                printf( "\n" );
            printf( "The problem is SAT after %d iterations.  ", Iter );
            break;
        }
        assert( status == l_False );
        nLits = sat_solver_final( pSat, &pLits );
        if ( fVerbose )
        {
            printf( "Iter%6d : ",       Iter+1 );
            printf( "Var =%10d  ",      sat_solver_nvars(pSat) );
            printf( "Clause =%10d  ",   sat_solver_nclauses(pSat) );
            printf( "Conflict =%10d  ", sat_solver_nconflicts(pSat) );
            printf( "Subset =%6d  ",    nLits );
            Abc_PrintTime( 1, "Time", clkSat );
//            ABC_PRTr( "Solver time", clkSat );
        }
        if ( Vec_IntSize(vLits) == nLits )
        {
//            if ( fVerbose )
//                printf( "\n" );
            printf( "Reached fixed point with %d entries after %d iterations.  ", Vec_IntSize(vLits), Iter+1 );
            break;
        }
        // collect used literals
        Vec_IntClear( vLits );
        for ( i = 0; i < nLits; i++ )
            Vec_IntPush( vLits, Abc_LitNot(pLits[i]) );
    }
    // create map
    vMap = Vec_IntStart( pCnf->nVars );
    Vec_IntForEachEntry( vLits, iLit, i )
        Vec_IntWriteEntry( vMap, Abc_Lit2Var(iLit), 1 );

    // create output
    Vec_IntFree( vLits );
    vLits = Vec_IntDup(vInit);
    Gia_ManForEachPi( pM, pObj, i )
        if ( i == Gia_ManRegNum(p) )
            break;
        else if ( Vec_IntEntry(vLits, i) == 4 || Vec_IntEntry(vLits, i) == 5 )
            Vec_IntWriteEntry( vLits, i, Vec_IntEntry(vLits, i) );
        else if ( (Vec_IntEntry(vLits, i) == 0 || Vec_IntEntry(vLits, i) == 1) && !Vec_IntEntry(vMap, pCnf->pVarNums[Gia_ObjId(pM, pObj)]) )
            Vec_IntWriteEntry( vLits, i, Vec_IntEntry(vLits, i) | 2 );
    Vec_IntFree( vMap );

    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pM );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return vLits;
}